

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_hmac.c
# Opt level: O2

int tc_hmac_set_key(TCHmacState_t ctx,uint8_t *key,uint key_size)

{
  long lVar1;
  int iVar2;
  ulong datalen;
  undefined8 uStack_130;
  undefined1 local_128 [8];
  tc_hmac_state_struct dummy_state;
  
  dummy_state.key._120_8_ = local_128;
  iVar2 = 0;
  if (key_size != 0 && (key != (uint8_t *)0x0 && ctx != (TCHmacState_t)0x0)) {
    datalen = (ulong)key_size;
    lVar1 = -(datalen + 0xf & 0xfffffffffffffff0);
    if (key_size < 0x41) {
      *(undefined8 *)((long)&uStack_130 + lVar1) = 0x117a11;
      tc_sha256_init((TCSha256State_t)local_128);
      *(undefined8 *)((long)&uStack_130 + lVar1) = 0x117a23;
      tc_sha256_update((TCSha256State_t)local_128,local_128 + lVar1,datalen);
      *(undefined8 *)((long)&uStack_130 + lVar1) = 0x117a36;
      tc_sha256_final(dummy_state.key + 0x18,(TCSha256State_t)local_128);
    }
    else {
      dummy_state.key._120_8_ = local_128;
      *(undefined8 *)((long)&uStack_130 + lVar1) = 0x117a4d;
      tc_sha256_init(&ctx->hash_state);
      *(undefined8 *)((long)&uStack_130 + lVar1) = 0x117a5b;
      tc_sha256_update(&ctx->hash_state,key,datalen);
      key = ctx->key + 0x20;
      *(undefined8 *)((long)&uStack_130 + lVar1) = 0x117a71;
      tc_sha256_final(key,&ctx->hash_state);
      *(undefined8 *)((long)&uStack_130 + lVar1) = 0x20;
      key_size = (uint)*(undefined8 *)((long)&uStack_130 + lVar1);
    }
    *(undefined8 *)((long)&uStack_130 + lVar1) = 0x117a7f;
    rekey(ctx->key,key,key_size);
    *(undefined8 *)(dummy_state.key._120_8_ + -8) = 1;
    iVar2 = (int)*(undefined8 *)(dummy_state.key._120_8_ + -8);
  }
  return iVar2;
}

Assistant:

int tc_hmac_set_key(TCHmacState_t ctx, const uint8_t *key,
		    unsigned int key_size)
{

	/* input sanity check: */
	if (ctx == (TCHmacState_t) 0 ||
	    key == (const uint8_t *) 0 ||
	    key_size == 0) {
		return TC_CRYPTO_FAIL;
	}

	const uint8_t dummy_key[key_size];
	struct tc_hmac_state_struct dummy_state;

	if (key_size <= TC_SHA256_BLOCK_SIZE) {
		/*
		 * The next three lines consist of dummy calls just to avoid
		 * certain timing attacks. Without these dummy calls,
		 * adversaries would be able to learn whether the key_size is
		 * greater than TC_SHA256_BLOCK_SIZE by measuring the time
		 * consumed in this process.
		 */
		(void)tc_sha256_init(&dummy_state.hash_state);
		(void)tc_sha256_update(&dummy_state.hash_state,
				       dummy_key,
				       key_size);
		(void)tc_sha256_final(&dummy_state.key[TC_SHA256_DIGEST_SIZE],
				      &dummy_state.hash_state);

		/* Actual code for when key_size <= TC_SHA256_BLOCK_SIZE: */
		rekey(ctx->key, key, key_size);
	} else {
		(void)tc_sha256_init(&ctx->hash_state);
		(void)tc_sha256_update(&ctx->hash_state, key, key_size);
		(void)tc_sha256_final(&ctx->key[TC_SHA256_DIGEST_SIZE],
				      &ctx->hash_state);
		rekey(ctx->key,
		      &ctx->key[TC_SHA256_DIGEST_SIZE],
		      TC_SHA256_DIGEST_SIZE);
	}

	return TC_CRYPTO_SUCCESS;
}